

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void nn_hash_erase(nn_hash *self,nn_hash_item *item)

{
  uint32_t uVar1;
  nn_list *in_RSI;
  uint *in_RDI;
  uint32_t slot;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = nn_hash_key(*(uint32_t *)&in_RSI->first);
  nn_list_erase(in_RSI,(nn_list_item *)CONCAT44(uVar1 % *in_RDI,in_stack_ffffffffffffffe8));
  in_RDI[1] = in_RDI[1] - 1;
  return;
}

Assistant:

void nn_hash_erase (struct nn_hash *self, struct nn_hash_item *item)
{
    uint32_t slot;

    slot = nn_hash_key (item->key) % self->slots;
    nn_list_erase (&self->array [slot], &item->list);
	--self->items;
}